

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O0

void emit_GLSL_DST(Context *ctx)

{
  char local_198 [8];
  char code [128];
  char src1_w [64];
  char src0_z [64];
  char src1_y [64];
  char src0_y [64];
  Context *ctx_local;
  
  make_GLSL_srcarg_string_y(ctx,0,src1_y + 0x38,0x40);
  make_GLSL_srcarg_string_y(ctx,1,src0_z + 0x38,0x40);
  make_GLSL_srcarg_string_z(ctx,0,src1_w + 0x38,0x40);
  make_GLSL_srcarg_string_w(ctx,1,code + 0x78,0x40);
  make_GLSL_destarg_assign
            (ctx,local_198,0x80,"vec4(1.0, %s * %s, %s, %s)",src1_y + 0x38,src0_z + 0x38,
             src1_w + 0x38,code + 0x78);
  output_line(ctx,"%s",local_198);
  return;
}

Assistant:

static void emit_GLSL_DST(Context *ctx)
{
    // !!! FIXME: needs to take ctx->dst_arg.writemask into account.
    char src0_y[64]; make_GLSL_srcarg_string_y(ctx, 0, src0_y, sizeof (src0_y));
    char src1_y[64]; make_GLSL_srcarg_string_y(ctx, 1, src1_y, sizeof (src1_y));
    char src0_z[64]; make_GLSL_srcarg_string_z(ctx, 0, src0_z, sizeof (src0_z));
    char src1_w[64]; make_GLSL_srcarg_string_w(ctx, 1, src1_w, sizeof (src1_w));

    char code[128];
    make_GLSL_destarg_assign(ctx, code, sizeof (code),
                             "vec4(1.0, %s * %s, %s, %s)",
                             src0_y, src1_y, src0_z, src1_w);
    output_line(ctx, "%s", code);
}